

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

bool testing::internal::ParseInt32(Message *src_text,char *str,Int32 *value)

{
  long lVar1;
  Message *pMVar2;
  char *str_local;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  char *end;
  string local_38;
  
  end = (char *)0x0;
  str_local = str;
  lVar1 = strtol(str,&end,10);
  if (*end == '\0') {
    if ((int)lVar1 == lVar1) {
      *value = (int)lVar1;
      return true;
    }
    Message::Message((Message *)&local_48);
    std::operator<<((ostream *)(local_48._M_head_impl + 0x10),"WARNING: ");
    testing::operator<<((ostream *)(local_48._M_head_impl + 0x10),src_text);
    std::operator<<((ostream *)(local_48._M_head_impl + 0x10),
                    " is expected to be a 32-bit integer, but actually");
    std::operator<<((ostream *)(local_48._M_head_impl + 0x10)," has value ");
    pMVar2 = Message::operator<<((Message *)&local_48,&str_local);
    Message::operator<<(pMVar2,(char (*) [20])", which overflows.\n");
  }
  else {
    Message::Message((Message *)&local_48);
    std::operator<<((ostream *)(local_48._M_head_impl + 0x10),"WARNING: ");
    testing::operator<<((ostream *)(local_48._M_head_impl + 0x10),src_text);
    std::operator<<((ostream *)(local_48._M_head_impl + 0x10),
                    " is expected to be a 32-bit integer, but actually");
    std::operator<<((ostream *)(local_48._M_head_impl + 0x10)," has value \"");
    pMVar2 = Message::operator<<((Message *)&local_48,&str_local);
    Message::operator<<(pMVar2,(char (*) [4])"\".\n");
  }
  StringStreamToString(&local_38,local_48._M_head_impl);
  printf("%s",local_38._M_dataplus._M_p);
  std::__cxx11::string::_M_dispose();
  fflush(_stdout);
  if (local_48._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
  return false;
}

Assistant:

bool ParseInt32(const Message& src_text, const char* str, Int32* value) {
  // Parses the environment variable as a decimal integer.
  char* end = nullptr;
  const long long_value = strtol(str, &end, 10);  // NOLINT

  // Has strtol() consumed all characters in the string?
  if (*end != '\0') {
    // No - an invalid character was encountered.
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value \"" << str << "\".\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  // Is the parsed value in the range of an Int32?
  const Int32 result = static_cast<Int32>(long_value);
  if (long_value == LONG_MAX || long_value == LONG_MIN ||
      // The parsed value overflows as a long.  (strtol() returns
      // LONG_MAX or LONG_MIN when the input overflows.)
      result != long_value
      // The parsed value overflows as an Int32.
      ) {
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value " << str << ", which overflows.\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  *value = result;
  return true;
}